

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfHeaderStringAttribute(ImfHeader *hdr,char *name,char **value)

{
  TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  undefined8 uVar1;
  Header *in_RDX;
  ImfHeader *in_RDI;
  exception *e;
  char *in_stack_ffffffffffffffd8;
  
  anon_unknown.dwarf_572a3::header(in_RDI);
  this = Imf_3_2::Header::typedAttribute<Imf_3_2::TypedAttribute<std::__cxx11::string>>
                   (in_RDX,in_stack_ffffffffffffffd8);
  Imf_3_2::
  TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  value(this);
  uVar1 = std::__cxx11::string::c_str();
  *(undefined8 *)&(in_RDX->_map)._M_t._M_impl = uVar1;
  return 1;
}

Assistant:

int
ImfHeaderStringAttribute (
    const ImfHeader* hdr, const char name[], const char** value)
{
    try
    {
        *value = header (hdr)
                     ->typedAttribute<
                         OPENEXR_IMF_INTERNAL_NAMESPACE::StringAttribute> (name)
                     .value ()
                     .c_str ();

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}